

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

filepos_t MATROSKA_MetaSeekAbsolutePos(matroska_seekpoint *MetaSeek)

{
  filepos_t fVar1;
  ebml_context *Context;
  bool_t bVar2;
  filepos_t fVar3;
  bool bVar4;
  ebml_element *local_28;
  ebml_element *RSegment;
  filepos_t RelPos;
  matroska_seekpoint *MetaSeek_local;
  
  fVar1 = MATROSKA_MetaSeekPosInSegment(MetaSeek);
  if (fVar1 == -1) {
    MetaSeek_local = (matroska_seekpoint *)0xffffffffffffffff;
  }
  else {
    local_28 = (ebml_element *)(MetaSeek->Base).Base.Base.Parent;
    while( true ) {
      bVar4 = false;
      if (local_28 != (ebml_element *)0x0) {
        Context = MATROSKA_getContextSegment();
        bVar2 = EBML_ElementIsType(local_28,Context);
        bVar4 = bVar2 == 0;
      }
      if (!bVar4) break;
      local_28 = (ebml_element *)(local_28->Base).Parent;
    }
    if (local_28 == (ebml_element *)0x0) {
      MetaSeek_local = (matroska_seekpoint *)0xffffffffffffffff;
    }
    else {
      fVar3 = EBML_ElementPositionData(local_28);
      MetaSeek_local = (matroska_seekpoint *)(fVar1 + fVar3);
    }
  }
  return (filepos_t)MetaSeek_local;
}

Assistant:

filepos_t MATROSKA_MetaSeekAbsolutePos(const matroska_seekpoint *MetaSeek)
{
    filepos_t RelPos = MATROSKA_MetaSeekPosInSegment(MetaSeek);
    ebml_element *RSegment;
    if (RelPos==INVALID_FILEPOS_T)
        return INVALID_FILEPOS_T;

    RSegment = EBML_ElementParent(MetaSeek);
    while (RSegment && !EBML_ElementIsType(RSegment, MATROSKA_getContextSegment()))
        RSegment = EBML_ElementParent(RSegment);
    if (!RSegment)
        return INVALID_FILEPOS_T;

    return RelPos + EBML_ElementPositionData(RSegment);
}